

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.c
# Opt level: O3

input_t inputroutine_keyboard(tgestate_t *state)

{
  byte bVar1;
  input_t iVar2;
  input_t iVar3;
  
  bVar1 = (*state->speccy->in)(state->speccy,(ushort)(state->keydefs).defs[0].port << 8 | 0xfe);
  iVar2 = 3;
  if (((state->keydefs).defs[0].mask & ~bVar1) == 0) {
    bVar1 = (*state->speccy->in)(state->speccy,(ushort)(state->keydefs).defs[1].port << 8 | 0xfe);
    iVar2 = 6;
    if (((state->keydefs).defs[1].mask & ~bVar1) == 0) {
      iVar2 = 0;
    }
  }
  bVar1 = (*state->speccy->in)(state->speccy,(ushort)(state->keydefs).defs[2].port << 8 | 0xfe);
  if (((state->keydefs).defs[2].mask & ~bVar1) == 0) {
    bVar1 = (*state->speccy->in)(state->speccy,(ushort)(state->keydefs).defs[3].port << 8 | 0xfe);
    iVar3 = iVar2 + 2;
    if (((state->keydefs).defs[3].mask & ~bVar1) == 0) {
      iVar3 = iVar2;
    }
  }
  else {
    iVar3 = iVar2 + 1;
  }
  bVar1 = (*state->speccy->in)(state->speccy,(ushort)(state->keydefs).defs[4].port << 8 | 0xfe);
  iVar2 = iVar3 + 9;
  if (((state->keydefs).defs[4].mask & ~bVar1) == 0) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

static input_t inputroutine_keyboard(tgestate_t *state)
{
  const keydef_t *def;         /* was HL */
  input_t         inputs;      /* was E */
  uint16_t        port;        /* was BC */
  uint8_t         key_pressed; /* was A */

  assert(state != NULL);

  def = &state->keydefs.defs[0]; /* A list of (port high byte, key mask) */

  /* Left or right? */
  port = (def->port << 8) | 0xFE;
  key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
  def++;
  if (key_pressed)
  {
    def++; /* Skip right keydef */
    inputs = input_LEFT;
  }
  else
  {
    /* Right */
    port = (def->port << 8) | 0xFE;
    key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
    def++;
    if (key_pressed)
      inputs = input_RIGHT;
    else
      inputs = input_NONE; /* == 0 */
  }

  /* Up or down? */
  port = (def->port << 8) | 0xFE;
  key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
  def++;
  if (key_pressed)
  {
    def++; /* Skip down keydef */
    inputs += input_UP;
  }
  else
  {
    /* Down */
    port = (def->port << 8) | 0xFE;
    key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
    def++;
    if (key_pressed)
      inputs += input_DOWN;
  }

  /* Fire? */
  port = (def->port << 8) | 0xFE;
  key_pressed = ~state->speccy->in(state->speccy, port) & def->mask;
  if (key_pressed)
    inputs += input_FIRE;

  return inputs;
}